

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Generators<arg_res_tuple<double,_2UL>_> * __thiscall
Catch::Generators::
makeGenerators<arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>>
          (Generators<arg_res_tuple<double,_2UL>_> *__return_storage_ptr__,Generators *this,
          arg_res_tuple<double,_2UL> *val,arg_res_tuple<double,_2UL> *moreGenerators,
          arg_res_tuple<double,_2UL> *moreGenerators_1,arg_res_tuple<double,_2UL> *moreGenerators_2,
          arg_res_tuple<double,_2UL> *moreGenerators_3,arg_res_tuple<double,_2UL> *moreGenerators_4,
          arg_res_tuple<double,_2UL> *moreGenerators_5)

{
  long lVar1;
  GeneratorWrapper<arg_res_tuple<double,_2UL>_> local_38;
  
  local_38.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>.
  _M_head_impl = (unique_ptr<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  )operator_new(0x20);
  *(undefined ***)
   local_38.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>.
   _M_head_impl = &PTR__GeneratorUntypedBase_0031a8b8;
  lVar1 = *(long *)(this + 8);
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>
                  ._M_head_impl + 8) = *(long *)this;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>
                  ._M_head_impl + 0x10) = lVar1;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>
                  ._M_head_impl + 0x18) = *(long *)(this + 0x10);
  Generators<arg_res_tuple<double,2ul>>::
  Generators<Catch::Generators::GeneratorWrapper<arg_res_tuple<double,2ul>>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>>
            ((Generators<arg_res_tuple<double,2ul>> *)__return_storage_ptr__,&local_38,val,
             moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3,moreGenerators_4);
  if (local_38.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<double,_2UL>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }